

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes_size_t<_IO_FILE*>
               (void *ptr,size_t n_els,_IO_FILE **in,PlatformSize saved_size_t,
               bool has_same_endianness)

{
  runtime_error *this;
  int in_ECX;
  byte in_R8B;
  vector<char,_std::allocator<char>_> buffer;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 diff_endian;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  void *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  string local_68 [75];
  byte local_1d;
  int local_1c;
  
  diff_endian = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  local_1d = in_R8B & 1;
  local_1c = in_ECX;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x68062f);
  if (local_1c == 2) {
    read_bytes<unsigned_long,unsigned_int>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (FILE **)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)diff_endian);
  }
  else {
    if (local_1c != 3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                 (allocator<char> *)in_stack_fffffffffffffe80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                 (allocator<char> *)in_stack_fffffffffffffe80);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                 (allocator<char> *)in_stack_fffffffffffffe80);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::__cxx11::to_string(in_stack_fffffffffffffe9c);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                 (allocator<char> *)in_stack_fffffffffffffe80);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::runtime_error::runtime_error(this,local_68);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    read_bytes<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (FILE **)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)diff_endian);
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffe60);
  return;
}

Assistant:

void read_bytes_size_t(void *ptr, const size_t n_els, itype &in, const PlatformSize saved_size_t, const bool has_same_endianness)
{
    std::vector<char> buffer;
    switch(saved_size_t)
    {
        case Is32Bit:
        {
            read_bytes<size_t, uint32_t>(ptr, n_els, in, buffer, !has_same_endianness);
            break;
        }

        case Is64Bit:
        {
            read_bytes<size_t, uint64_t>(ptr, n_els, in, buffer, !has_same_endianness);
            break;
        }

        default:
        {
            unexpected_error();
        }
    }
}